

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# family.cc
# Opt level: O0

vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_> * __thiscall
prometheus::Family<prometheus::Gauge>::Collect
          (vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>
           *__return_storage_ptr__,Family<prometheus::Gauge> *this)

{
  initializer_list<prometheus::MetricFamily> __l;
  bool bVar1;
  size_type __n;
  reference metric_labels;
  pointer metric;
  MetricFamily *local_210;
  allocator<prometheus::MetricFamily> local_1c1;
  MetricFamily *local_1c0;
  MetricFamily local_1b8;
  iterator local_158;
  size_type local_150;
  ClientMetric local_148;
  reference local_b8;
  value_type *m;
  const_iterator __end0;
  const_iterator __begin0;
  unordered_map<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::unique_ptr<prometheus::Gauge,_std::default_delete<prometheus::Gauge>_>,_prometheus::detail::LabelHasher,_std::equal_to<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::unique_ptr<prometheus::Gauge,_std::default_delete<prometheus::Gauge>_>_>_>_>
  *__range2;
  undefined1 auStack_88 [8];
  MetricFamily family;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  Family<prometheus::Gauge> *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mutex_);
  bVar1 = std::
          unordered_map<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::unique_ptr<prometheus::Gauge,_std::default_delete<prometheus::Gauge>_>,_prometheus::detail::LabelHasher,_std::equal_to<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::unique_ptr<prometheus::Gauge,_std::default_delete<prometheus::Gauge>_>_>_>_>
          ::empty(&this->metrics_);
  if (bVar1) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::vector
              (__return_storage_ptr__);
    family.metric.
    super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else {
    family.metric.
    super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    family.metric.
    super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    family.help.field_2._8_8_ = 0;
    family.type = Counter;
    family._68_4_ = 0;
    family.help._M_string_length = 0;
    family.help.field_2._M_allocated_capacity = 0;
    family.name.field_2._8_8_ = 0;
    family.help._M_dataplus = (_Alloc_hider)0x0;
    family.help._1_7_ = 0;
    family.name._M_string_length = 0;
    family.name.field_2._M_allocated_capacity = 0;
    auStack_88 = (undefined1  [8])0x0;
    family.name._M_dataplus = (_Alloc_hider)0x0;
    family.name._1_7_ = 0;
    MetricFamily::MetricFamily((MetricFamily *)auStack_88);
    std::__cxx11::string::operator=((string *)auStack_88,(string *)&this->name_);
    std::__cxx11::string::operator=
              ((string *)(family.name.field_2._M_local_buf + 8),(string *)&this->help_);
    family.help.field_2._8_4_ = 1;
    __n = std::
          unordered_map<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::unique_ptr<prometheus::Gauge,_std::default_delete<prometheus::Gauge>_>,_prometheus::detail::LabelHasher,_std::equal_to<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::unique_ptr<prometheus::Gauge,_std::default_delete<prometheus::Gauge>_>_>_>_>
          ::size(&this->metrics_);
    std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>::reserve
              ((vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_> *)
               &family.type,__n);
    __end0 = std::
             unordered_map<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::unique_ptr<prometheus::Gauge,_std::default_delete<prometheus::Gauge>_>,_prometheus::detail::LabelHasher,_std::equal_to<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::unique_ptr<prometheus::Gauge,_std::default_delete<prometheus::Gauge>_>_>_>_>
             ::begin(&this->metrics_);
    m = (value_type *)
        std::
        unordered_map<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::unique_ptr<prometheus::Gauge,_std::default_delete<prometheus::Gauge>_>,_prometheus::detail::LabelHasher,_std::equal_to<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::unique_ptr<prometheus::Gauge,_std::default_delete<prometheus::Gauge>_>_>_>_>
        ::end(&this->metrics_);
    while( true ) {
      bVar1 = std::__detail::operator!=
                        (&__end0.
                          super__Node_iterator_base<std::pair<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::unique_ptr<prometheus::Gauge,_std::default_delete<prometheus::Gauge>_>_>,_true>
                         ,(_Node_iterator_base<std::pair<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::unique_ptr<prometheus::Gauge,_std::default_delete<prometheus::Gauge>_>_>,_true>
                           *)&m);
      if (!bVar1) break;
      metric_labels =
           std::__detail::
           _Node_const_iterator<std::pair<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::unique_ptr<prometheus::Gauge,_std::default_delete<prometheus::Gauge>_>_>,_false,_true>
           ::operator*(&__end0);
      local_b8 = metric_labels;
      metric = std::unique_ptr<prometheus::Gauge,_std::default_delete<prometheus::Gauge>_>::get
                         (&metric_labels->second);
      CollectMetric(&local_148,this,&metric_labels->first,metric);
      std::vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>::push_back
                ((vector<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_> *)
                 &family.type,&local_148);
      ClientMetric::~ClientMetric(&local_148);
      std::__detail::
      _Node_const_iterator<std::pair<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::unique_ptr<prometheus::Gauge,_std::default_delete<prometheus::Gauge>_>_>,_false,_true>
      ::operator++(&__end0);
    }
    local_1c0 = &local_1b8;
    MetricFamily::MetricFamily(local_1c0,(MetricFamily *)auStack_88);
    local_158 = &local_1b8;
    local_150 = 1;
    std::allocator<prometheus::MetricFamily>::allocator(&local_1c1);
    __l._M_len = local_150;
    __l._M_array = local_158;
    std::vector<prometheus::MetricFamily,_std::allocator<prometheus::MetricFamily>_>::vector
              (__return_storage_ptr__,__l,&local_1c1);
    std::allocator<prometheus::MetricFamily>::~allocator(&local_1c1);
    local_210 = (MetricFamily *)&local_158;
    do {
      local_210 = local_210 + -1;
      MetricFamily::~MetricFamily(local_210);
    } while (local_210 != &local_1b8);
    family.metric.
    super__Vector_base<prometheus::ClientMetric,_std::allocator<prometheus::ClientMetric>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    MetricFamily::~MetricFamily((MetricFamily *)auStack_88);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return __return_storage_ptr__;
}

Assistant:

std::vector<MetricFamily> Family<T>::Collect() const {
  std::lock_guard<std::mutex> lock{mutex_};

  if (metrics_.empty()) {
    return {};
  }

  auto family = MetricFamily{};
  family.name = name_;
  family.help = help_;
  family.type = T::metric_type;
  family.metric.reserve(metrics_.size());
  for (const auto& m : metrics_) {
    family.metric.push_back(std::move(CollectMetric(m.first, m.second.get())));
  }
  return {family};
}